

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

void sensors_analytics::Sdk::ItemSet(string *item_type,string *item_id,PropertiesNode *properties)

{
  Sdk *this;
  allocator local_49;
  string local_48;
  
  this = instance_;
  if (instance_ != (Sdk *)0x0) {
    std::__cxx11::string::string((string *)&local_48,"item_set",&local_49);
    AddItemEvent(this,&local_48,item_type,item_id,&properties->super_ObjectNode);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void Sdk::ItemSet(const std::string &item_type, const std::string &item_id,
                  sensors_analytics::PropertiesNode &properties) {
  if (instance_) {
    instance_->AddItemEvent("item_set", item_type, item_id, properties);
  }
}